

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::SetTrimBoundingBoxes(ON_Brep *this,ON_BrepLoop *loop,bool bLazy)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  byte local_40;
  
  iVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar2 = (loop->m_ti).m_count;
  if (((int)CONCAT71(in_register_00000011,bLazy) == 0) ||
     (bVar4 = ON_BoundingBox::IsValid(&loop->m_pbox), !bVar4)) {
    ON_BoundingBox::Destroy(&loop->m_pbox);
    local_40 = 1;
  }
  else {
    local_40 = 0;
  }
  if (0 < (int)uVar2) {
    uVar7 = 0;
    bVar4 = true;
    do {
      iVar5 = (loop->m_ti).m_a[uVar7];
      lVar6 = (long)iVar5;
      bVar3 = bVar4;
      if ((-1 < lVar6) && (iVar5 < iVar1)) {
        iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])
                          (this,(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                super_ON_ClassArray<ON_BrepTrim>.m_a + lVar6,(ulong)bLazy);
        if ((byte)iVar5 == 0) {
          bVar3 = false;
        }
        if (((byte)iVar5 & local_40) == 1) {
          ON_BoundingBox::Union
                    (&loop->m_pbox,
                     &(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a[lVar6].m_pbox);
          bVar3 = bVar4;
        }
      }
      uVar7 = uVar7 + 1;
      bVar4 = bVar3;
    } while (uVar2 != uVar7);
    if (!bVar3) {
      return false;
    }
  }
  bVar4 = ON_BoundingBox::IsValid(&loop->m_pbox);
  return bVar4;
}

Assistant:

bool ON_Brep::SetTrimBoundingBoxes( ON_BrepLoop& loop, bool bLazy )
{
  // TL_Brep overrides this function and computes much tighter
  // bounding boxes that take trim.m_t[] into account.
  bool rc = true;
  int ti, lti, trim_count = m_T.Count(), lt_count = loop.m_ti.Count();
  bool bSetLoopBox = true;
  if ( bLazy && loop.m_pbox.IsValid() )
    bSetLoopBox = false;
  else
    loop.m_pbox.Destroy();
  for ( lti = 0; lti < lt_count; lti++ )
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < trim_count )
    {
      if ( !SetTrimBoundingBox( m_T[ti], bLazy ) )
        rc = false;
      else if ( bSetLoopBox )
        loop.m_pbox.Union( m_T[ti].m_pbox );
    }
  }
  return (rc && loop.m_pbox.IsValid()) ? true : false;
}